

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall String::compress(String *__return_storage_ptr__,String *this)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  int processed;
  int error;
  char local_8088 [8];
  char buffer [32768];
  z_stream stream;
  String *this_local;
  String *out;
  
  bVar1 = isEmpty(this);
  if (bVar1) {
    String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  }
  else {
    memset(buffer + 0x7ff8,0,0x70);
    iVar2 = deflateInit_(buffer + 0x7ff8,9,"1.2.11",0x70);
    if (iVar2 == 0) {
      buffer._32760_8_ = data(this);
      size(this);
      String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
      sVar3 = size(this);
      reserve(__return_storage_ptr__,sVar3 >> 1);
      iVar2 = deflate(buffer + 0x7ff8,4);
      if ((iVar2 == 0) || (iVar2 == 1)) {
        append(__return_storage_ptr__,local_8088,0);
      }
      else {
        clear(__return_storage_ptr__);
      }
      deflateEnd(buffer + 0x7ff8);
    }
    else {
      String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String String::compress() const
{
#ifndef RCT_HAVE_ZLIB
    assert(0 && "Rct configured without zlib support");
    return String();
#else
    if (isEmpty())
        return String();
    z_stream stream;
    memset(&stream, 0, sizeof(stream));

    if (::deflateInit(&stream, Z_BEST_COMPRESSION) != Z_OK)
        return String();

    stream.next_in = const_cast<Bytef*>(reinterpret_cast<const Bytef *>(data()));
    stream.avail_in = size();

    char buffer[BufferSize];

    String out;
    out.reserve(size() / 2);

    int error = 0;
    do {
        stream.next_out = reinterpret_cast<Bytef *>(buffer);
        stream.avail_out = sizeof(buffer);

        error = ::deflate(&stream, Z_FINISH);
        if (error != Z_OK && error != Z_STREAM_END) {
            out.clear();
            break;
        }

        const int processed = sizeof(buffer) - stream.avail_out;
        out.append(buffer, processed);
    } while (!stream.avail_out);

    deflateEnd(&stream);

    return out;
#endif
}